

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCube>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomCube *cube,
               string *warn,string *err,PrimReconstructOptions *options)

{
  size_type *psVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  ostream *poVar5;
  long *plVar6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  int iVar10;
  string *psVar11;
  bool bVar12;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  string local_290;
  _Base_ptr local_270;
  undefined1 local_268 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_250;
  string *local_240;
  long *local_238 [2];
  long local_228 [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_218;
  TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *local_210;
  _Base_ptr local_208;
  Property *local_200;
  string local_1f8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1d8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar12 = false;
  local_1d8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_240 = err;
  local_1d8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar4 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,&local_1d8,properties,&cube->super_GPrim,warn,err,
                     options->strict_allowedToken_check);
  if (bVar4) {
    p_Var9 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_208 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    bVar12 = p_Var9 == local_208;
    if (!bVar12) {
      local_210 = &cube->size;
      local_218 = &(cube->super_GPrim).props;
      do {
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,*(long *)(p_Var9 + 1),
                   (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
        psVar11 = local_1a8;
        local_270 = p_Var9;
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)psVar11,"size","");
        local_200 = (Property *)(p_Var9 + 2);
        anon_unknown_0::ParseTypedAttribute<double>
                  ((ParseResult *)local_268,&local_1d8,&local_1f8,(Property *)(p_Var9 + 2),psVar11,
                   local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        iVar10 = 0;
        if ((local_268._0_8_ & 0xfffffffd) == 0) {
          iVar10 = 3;
LAB_0021e672:
          bVar4 = false;
        }
        else {
          bVar4 = true;
          if (local_268._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0xe0b);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            local_238[0] = local_228;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[5],std::__cxx11::string>
                      (&local_290,(fmt *)local_238,(string *)"size",(char (*) [5])(local_268 + 8),
                       psVar11);
            poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_290._M_dataplus._M_p,
                                local_290._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            psVar11 = local_240;
            if (local_238[0] != local_228) {
              operator_delete(local_238[0],local_228[0] + 1);
            }
            if (psVar11 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar6 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_238,(ulong)(psVar11->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_290.field_2._M_allocated_capacity = *psVar1;
                local_290.field_2._8_8_ = plVar6[3];
                local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
              }
              else {
                local_290.field_2._M_allocated_capacity = *psVar1;
                local_290._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_290._M_string_length = plVar6[1];
              *plVar6 = (long)psVar1;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar11,(string *)&local_290);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._M_dataplus._M_p != &local_290.field_2) {
                operator_delete(local_290._M_dataplus._M_p,
                                local_290.field_2._M_allocated_capacity + 1);
              }
              if (local_238[0] != local_228) {
                operator_delete(local_238[0],local_228[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            iVar10 = 1;
            goto LAB_0021e672;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._8_8_ != &aStack_250) {
          operator_delete((void *)local_268._8_8_,aStack_250._M_allocated_capacity + 1);
        }
        if (bVar4) {
          p_Var9 = local_270 + 1;
          cVar7 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_1d8,(key_type *)p_Var9);
          p_Var2 = &local_1d8._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar7._M_node == p_Var2) {
            pmVar8 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[](local_218,(key_type *)p_Var9);
            ::std::__cxx11::string::_M_assign((string *)pmVar8);
            p_Var3 = local_270;
            (pmVar8->_attrib)._varying_authored = (bool)local_270[3].field_0x4;
            (pmVar8->_attrib)._variability = local_270[3]._M_color;
            ::std::__cxx11::string::_M_assign((string *)&(pmVar8->_attrib)._type_name);
            linb::any::operator=((any *)&(pmVar8->_attrib)._var,(any *)&p_Var3[4]._M_parent);
            (pmVar8->_attrib)._var._blocked = SUB41(p_Var3[5]._M_color,0);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::operator=(&(pmVar8->_attrib)._var._ts._samples,
                        (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&p_Var3[5]._M_parent);
            (pmVar8->_attrib)._var._ts._dirty = SUB41(p_Var3[6]._M_color,0);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(pmVar8->_attrib)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var3[6]._M_parent);
            AttrMetas::operator=(&(pmVar8->_attrib)._metas,(AttrMetas *)(p_Var3 + 7));
            *(_Base_ptr *)&pmVar8->_listOpQual = p_Var3[0x17]._M_parent;
            (pmVar8->_rel).type = *(Type *)&p_Var3[0x17]._M_left;
            Path::operator=(&(pmVar8->_rel).targetPath,(Path *)&p_Var3[0x17]._M_right);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(pmVar8->_rel).targetPathVector,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var3[0x1e]._M_parent);
            (pmVar8->_rel).listOpQual = p_Var3[0x1f]._M_color;
            AttrMetas::operator=(&(pmVar8->_rel)._metas,(AttrMetas *)&p_Var3[0x1f]._M_parent);
            (pmVar8->_rel)._varying_authored = *(bool *)&p_Var3[0x2f]._M_left;
            ::std::__cxx11::string::_M_assign((string *)&pmVar8->_prop_value_type_name);
            pmVar8->_has_custom = *(bool *)&p_Var3[0x30]._M_right;
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_1d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var9);
          }
          cVar7 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_1d8,(key_type *)p_Var9);
          iVar10 = 0;
          if ((_Rb_tree_header *)cVar7._M_node == p_Var2) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0xe0d);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_268,"Unsupported/unimplemented property: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var9);
            poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(char *)local_268._0_8_,local_268._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
              operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
            }
            psVar11 = local_240;
            if (local_240 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar6 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)&local_290,(ulong)(psVar11->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar6 + 2);
              if ((size_type *)*plVar6 == psVar1) {
                local_268._16_8_ = *psVar1;
                aStack_250._M_allocated_capacity = plVar6[3];
                local_268._0_8_ = local_268 + 0x10;
              }
              else {
                local_268._16_8_ = *psVar1;
                local_268._0_8_ = (size_type *)*plVar6;
              }
              local_268._8_8_ = plVar6[1];
              *plVar6 = (long)psVar1;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar11,(string *)local_268);
              if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
                operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._M_dataplus._M_p != &local_290.field_2) {
                operator_delete(local_290._M_dataplus._M_p,
                                local_290.field_2._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            iVar10 = 1;
          }
        }
        if ((iVar10 != 3) && (iVar10 != 0)) break;
        p_Var9 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)local_270);
        bVar12 = p_Var9 == local_208;
      } while (!bVar12);
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1d8,
             (_Link_type)local_1d8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar12;
}

Assistant:

bool ReconstructPrim<GeomCube>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomCube *cube,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  //
  // pxrUSD says... "If you author size you must also author extent."
  //
  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, cube, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    DCOUT("prop: " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "size", GeomCube, cube->size)
    ADD_PROPERTY(table, prop, GeomCube, cube->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}